

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::clauseAlphaHull(SelectionCompiler *this)

{
  any *in_RDI;
  Token tokenAlpha;
  any alpha;
  undefined4 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff50;
  SelectionCompiler *in_stack_ffffffffffffff58;
  undefined4 local_90;
  SelectionCompiler *in_stack_ffffffffffffff80;
  undefined4 local_68;
  undefined4 local_40;
  undefined1 local_1;
  
  tokenNext(in_stack_ffffffffffffff58);
  Token::~Token((Token *)0x37eaa6);
  tokenNext(in_stack_ffffffffffffff58);
  Token::~Token((Token *)0x37ead0);
  if (local_40 == 0x400) {
    std::any::any((any *)0x37eafd);
    tokenNext(in_stack_ffffffffffffff58);
    if (local_68 - 2U < 2) {
      std::any::operator=((any *)CONCAT44(local_40,in_stack_ffffffffffffff50),in_RDI);
      tokenNext(in_stack_ffffffffffffff58);
      Token::~Token((Token *)0x37eba2);
      if (local_90 == 0x401) {
        Token::Token((Token *)CONCAT44(in_stack_ffffffffffffff44,0x401),
                     CONCAT13(in_stack_ffffffffffffff3f,
                              CONCAT12(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c)),
                     (any *)0x37ebe8);
        local_1 = addTokenToPostfix((SelectionCompiler *)
                                    CONCAT44(in_stack_ffffffffffffff44,local_90),
                                    (Token *)CONCAT17(in_stack_ffffffffffffff3f,
                                                      CONCAT16(in_stack_ffffffffffffff3e,
                                                               CONCAT24(in_stack_ffffffffffffff3c,
                                                                        in_stack_ffffffffffffff38)))
                                   );
        Token::~Token((Token *)0x37ec16);
      }
      else {
        local_1 = rightParenthesisExpected(in_stack_ffffffffffffff80);
      }
    }
    else {
      local_1 = numberOrKeywordExpected(in_stack_ffffffffffffff80);
    }
    Token::~Token((Token *)0x37ec44);
    std::any::~any((any *)0x37ec4e);
  }
  else {
    local_1 = leftParenthesisExpected(in_stack_ffffffffffffff80);
  }
  return local_1;
}

Assistant:

bool SelectionCompiler::clauseAlphaHull() {
    tokenNext();                                // alphaHull
    if (tokenNext().tok != Token::leftparen) {  // (
      return leftParenthesisExpected();
    }

    std::any alpha;
    Token tokenAlpha = tokenNext();  // alpha
    switch (tokenAlpha.tok) {
    case Token::integer:
    case Token::decimal:
      alpha = tokenAlpha.value;
      break;
    default:
      return numberOrKeywordExpected();
    }

    if (tokenNext().tok != Token::rightparen) {  // )T
      return rightParenthesisExpected();
    }

    return addTokenToPostfix(Token(Token::alphahull, alpha));
  }